

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

uint32_t VP8GetValue(VP8BitReader *br,int bits)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  range_t rVar10;
  
  if (bits < 1) {
    uVar6 = 0;
  }
  else {
    rVar10 = br->range_;
    iVar4 = br->bits_;
    uVar5 = bits + 1;
    uVar6 = 0;
    do {
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          br->value_ = br->value_ << 0x38 |
                       ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                        (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                        (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          iVar4 = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar4 = br->bits_;
        }
      }
      uVar7 = rVar10 >> 1 & 0xffffff;
      uVar8 = (uint)(br->value_ >> ((byte)iVar4 & 0x3f));
      if (uVar7 < uVar8) {
        uVar9 = rVar10 - uVar7;
        br->value_ = br->value_ - ((ulong)uVar7 + 1 << ((byte)iVar4 & 0x3f));
      }
      else {
        uVar9 = uVar7 + 1;
      }
      uVar3 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      iVar4 = iVar4 - (uVar3 ^ 7);
      br->bits_ = iVar4;
      rVar10 = (uVar9 << ((byte)(uVar3 ^ 7) & 0x1f)) - 1;
      br->range_ = rVar10;
      uVar6 = uVar6 | (uint)(uVar7 < uVar8) << ((char)uVar5 - 2U & 0x1f);
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  return uVar6;
}

Assistant:

uint32_t VP8GetValue(VP8BitReader* const br, int bits, const char label[]) {
  uint32_t v = 0;
  while (bits-- > 0) {
    v |= VP8GetBit(br, 0x80, label) << bits;
  }
  return v;
}